

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void __thiscall
CMU462::DynamicScene::Scene::set_draw_styles
          (Scene *this,DrawStyle *defaultStyle,DrawStyle *hoveredStyle,DrawStyle *selectedStyle)

{
  _Base_ptr p_Var1;
  
  this->defaultStyle = defaultStyle;
  this->hoveredStyle = hoveredStyle;
  this->selectedStyle = selectedStyle;
  for (p_Var1 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->objects)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    (**(code **)**(undefined8 **)(p_Var1 + 1))
              (*(undefined8 **)(p_Var1 + 1),defaultStyle,hoveredStyle,selectedStyle);
  }
  return;
}

Assistant:

void Scene::set_draw_styles(DrawStyle *defaultStyle, DrawStyle *hoveredStyle,
                            DrawStyle *selectedStyle) {
  this->defaultStyle = defaultStyle;
  this->hoveredStyle = hoveredStyle;
  this->selectedStyle = selectedStyle;
  for (SceneObject *obj : objects) {
    obj->set_draw_styles(defaultStyle, hoveredStyle, selectedStyle);
  }
}